

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<double>::Matcher(Matcher<double> *this,double value)

{
  Matcher<double> *in_RDI;
  Matcher<double> *in_stack_ffffffffffffffa8;
  EqMatcher<double> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<double>::MatcherBase((MatcherBase<double> *)0x15c6fe);
  (in_RDI->super_MatcherBase<double>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00267b08;
  Eq<double>((double)in_stack_ffffffffffffffa8);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~Matcher((Matcher<double> *)0x15c758);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }